

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O1

int64_t __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::get_int64_value(basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
                  *this,error_code *ec)

{
  size_t *psVar1;
  byte *pbVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  byte *pbVar7;
  byte bVar8;
  ushort *puVar9;
  uint8_t b;
  uint8_t buf_2 [2];
  uint8_t buf [4];
  uint8_t buf_1 [8];
  byte local_27;
  ushort local_26;
  uint local_24;
  ulong local_20;
  
  pbVar7 = (this->source_).current_.p_;
  pbVar2 = (this->source_).end_.p_;
  if (pbVar7 == pbVar2) {
    uVar5 = 0x100;
  }
  else {
    uVar5 = (uint)*pbVar7;
  }
  if (0xff < uVar5) {
    std::error_code::operator=(ec,unexpected_eof);
    this->more_ = false;
    return 0;
  }
  bVar8 = (byte)uVar5 >> 5;
  if (bVar8 == 0) {
    uVar3 = get_uint64_value(this,ec);
    if ((long)uVar3 < 1) {
      uVar3 = 0;
    }
    if (ec->_M_value == 0) {
      return uVar3;
    }
    return 0;
  }
  if (bVar8 == 1) {
    bVar8 = (byte)uVar5 & 0x1f;
    if (pbVar7 != pbVar2) {
      psVar1 = &(this->source_).position_;
      *psVar1 = *psVar1 + 1;
      (this->source_).current_.p_ = pbVar7 + 1;
    }
    if (bVar8 < 0x18) {
      return (long)(char)~bVar8;
    }
    switch(bVar8) {
    case 0x18:
      pbVar7 = (this->source_).current_.p_;
      puVar9 = (ushort *)&local_27;
      if (pbVar7 != pbVar2) {
        local_27 = *pbVar7;
        puVar9 = &local_26;
        (this->source_).current_.p_ = pbVar7 + 1;
      }
      psVar1 = &(this->source_).position_;
      *psVar1 = (size_t)((long)puVar9 + (*psVar1 - (long)&local_27));
      if (puVar9 == (ushort *)&local_27) {
        std::error_code::operator=(ec,unexpected_eof);
        this->more_ = false;
        uVar4 = 0;
      }
      else {
        uVar4 = ~(ulong)local_27;
      }
      if (puVar9 == (ushort *)&local_27) {
        return 0;
      }
      break;
    case 0x19:
      pbVar7 = (this->source_).current_.p_;
      lVar6 = 0;
      do {
        if (pbVar7 == pbVar2) break;
        *(byte *)((long)&local_26 + lVar6) = *pbVar7;
        lVar6 = lVar6 + 1;
        pbVar7 = pbVar7 + 1;
        (this->source_).current_.p_ = pbVar7;
      } while (lVar6 == 1);
      psVar1 = &(this->source_).position_;
      *psVar1 = *psVar1 + lVar6;
      if (lVar6 != 2) {
        std::error_code::operator=(ec,unexpected_eof);
        this->more_ = false;
        return 0;
      }
      uVar4 = ~(ulong)(ushort)(local_26 << 8 | local_26 >> 8);
      break;
    case 0x1a:
      pbVar7 = (this->source_).current_.p_;
      lVar6 = 0;
      do {
        if (pbVar7 == pbVar2) break;
        *(byte *)((long)&local_24 + lVar6) = *pbVar7;
        lVar6 = lVar6 + 1;
        pbVar7 = pbVar7 + 1;
        (this->source_).current_.p_ = pbVar7;
      } while (lVar6 != 4);
      psVar1 = &(this->source_).position_;
      *psVar1 = *psVar1 + lVar6;
      if (lVar6 != 4) {
        std::error_code::operator=(ec,unexpected_eof);
        this->more_ = false;
        return 0;
      }
      uVar4 = ~(ulong)(local_24 >> 0x18 | (local_24 & 0xff0000) >> 8 | (local_24 & 0xff00) << 8 |
                      local_24 << 0x18);
      break;
    case 0x1b:
      pbVar7 = (this->source_).current_.p_;
      lVar6 = 0;
      do {
        if (pbVar7 == pbVar2) break;
        *(byte *)((long)&local_20 + lVar6) = *pbVar7;
        lVar6 = lVar6 + 1;
        pbVar7 = pbVar7 + 1;
        (this->source_).current_.p_ = pbVar7;
      } while (lVar6 != 8);
      psVar1 = &(this->source_).position_;
      *psVar1 = *psVar1 + lVar6;
      if (lVar6 != 8) {
        std::error_code::operator=(ec,unexpected_eof);
        this->more_ = false;
        return 0;
      }
      uVar4 = ~local_20;
      uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
              | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18
              | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
      break;
    default:
      goto switchD_002f092d_default;
    }
  }
  else {
switchD_002f092d_default:
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

int64_t get_int64_value(std::error_code& ec)
    {
        int64_t val = 0;

        auto ch = source_.peek();
        if (ch.eof)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return val;
        }

        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(ch.value);
        uint8_t info = get_additional_information_value(ch.value);
        switch (major_type)
        {
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
                source_.ignore(1);
                switch (info)
                {
                    case JSONCONS_EXT_CBOR_0x00_0x17: // 0x00..0x17 (0..23)
                    {
                        val = static_cast<int8_t>(- 1 - info);
                        break;
                    }
                    case 0x18: // Negative integer (one-byte uint8_t follows)
                        {
                            uint8_t b;
                            if (source_.read(&b, 1) == 0)
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            val = static_cast<int64_t>(-1) - static_cast<int64_t>(b);
                            break;
                        }

                    case 0x19: // Negative integer -1-n (two-byte uint16_t follows)
                        {
                            uint8_t buf[sizeof(uint16_t)];
                            if (source_.read(buf, sizeof(uint16_t)) != sizeof(uint16_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint16_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- x;
                            break;
                        }

                    case 0x1a: // Negative integer -1-n (four-byte uint32_t follows)
                        {
                            uint8_t buf[sizeof(uint32_t)];
                            if (source_.read(buf, sizeof(uint32_t)) != sizeof(uint32_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint32_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- x;
                            break;
                        }

                    case 0x1b: // Negative integer -1-n (eight-byte uint64_t follows)
                        {
                            uint8_t buf[sizeof(uint64_t)];
                            if (source_.read(buf, sizeof(uint64_t)) != sizeof(uint64_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint64_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- static_cast<int64_t>(x);
                            break;
                        }
                }
                break;

                case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
                {
                    uint64_t x = get_uint64_value(ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return 0;
                    }
                    if (x <= static_cast<uint64_t>((std::numeric_limits<int64_t>::max)()))
                    {
                        val = x;
                    }
                    else
                    {
                        // error;
                    }
                    
                    break;
                }
                break;
            default:
                break;
        }

        return val;
    }